

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_record.cpp
# Opt level: O0

void __thiscall cubeb_record_Test::TestBody(cubeb_record_Test *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Message *pMVar4;
  char *pcVar5;
  unique_ptr<cubeb_stream,_void_(*)(cubeb_stream_*)> cleanup_stream_at_exit;
  AssertionResult gtest_ar_1;
  unique_ptr<cubeb,_void_(*)(cubeb_*)> cleanup_cubeb_at_exit;
  AssertionResult gtest_ar;
  user_state_record stream_state;
  int r;
  cubeb_stream_params params;
  cubeb_stream *stream;
  cubeb *ctx;
  pointer in_stack_ffffffffffffff08;
  cubeb_stream *__p;
  cubeb_log_level in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  char (*in_stack_ffffffffffffff18) [33];
  code *val;
  Message *in_stack_ffffffffffffff20;
  code *this_00;
  cubeb *in_stack_ffffffffffffff28;
  AssertHelper in_stack_ffffffffffffff58;
  cubeb_stream_params *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff78;
  code *context;
  AssertHelper local_60 [2];
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar6;
  uint in_stack_ffffffffffffffb8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffc0;
  cubeb_state_callback in_stack_ffffffffffffffc8;
  
  iVar2 = cubeb_set_log_callback
                    (in_stack_ffffffffffffff10,(cubeb_log_callback)in_stack_ffffffffffffff08);
  if (iVar2 != 0) {
    fprintf(_stderr,"Set log callback failed\n");
  }
  user_state_record::user_state_record((user_state_record *)0x133674);
  iVar2 = common_init((cubeb **)in_stack_ffffffffffffff20,*in_stack_ffffffffffffff18);
  uVar6 = 0;
  testing::internal::EqHelper<false>::Compare<int,__0>
            ((char *)in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20,
             (int *)in_stack_ffffffffffffff18,
             (anon_enum_32 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffb8);
  if (!bVar1) {
    testing::Message::Message(in_stack_ffffffffffffff20);
    pMVar4 = testing::Message::operator<<(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x133710);
    testing::internal::AssertHelper::AssertHelper
              (local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_record.cpp"
               ,0x52,pcVar5);
    testing::internal::AssertHelper::operator=(local_60,pMVar4);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    testing::Message::~Message((Message *)0x13375d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x133782);
  if (bVar1) {
    context = cubeb_destroy;
    std::unique_ptr<cubeb,void(*)(cubeb*)>::unique_ptr<void(*)(cubeb*),void>
              ((unique_ptr<cubeb,_void_(*)(cubeb_*)> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08,
               (__enable_if_t<_is_lvalue_reference<void_(*)(cubeb_*)>::value,_void_(*&&)(cubeb_*)>)
               0x1337ba);
    iVar3 = has_available_input_device(in_stack_ffffffffffffff28);
    if (iVar3 != 0) {
      pcVar5 = &stack0xffffffffffffffcc;
      __p = (pointer)0x0;
      in_stack_ffffffffffffff10 = 0x1000;
      val = data_cb_record;
      this_00 = state_cb_record;
      cubeb_stream_init((cubeb *)context,(cubeb_stream **)in_stack_ffffffffffffff78.ptr_,
                        in_stack_ffffffffffffff70,
                        (cubeb_devid)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                        in_stack_ffffffffffffff60,in_stack_ffffffffffffff58.data_,
                        (cubeb_stream_params *)CONCAT44(uVar6,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffb8,
                        (cubeb_data_callback)in_stack_ffffffffffffffc0.ptr_,
                        in_stack_ffffffffffffffc8,(void *)CONCAT44(2,iVar2));
      testing::internal::EqHelper<false>::Compare<int,__0>
                (pcVar5,(char *)this_00,(int *)val,
                 (anon_enum_32 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xffffffffffffff70);
      if (!bVar1) {
        testing::Message::Message((Message *)this_00);
        pMVar4 = testing::Message::operator<<((Message *)this_00,(char (*) [32])val);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x1338e4);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_record.cpp"
                   ,0x65,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff58,pMVar4);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff58);
        testing::Message::~Message((Message *)0x133925);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x133947);
      if (bVar1) {
        std::unique_ptr<cubeb_stream,void(*)(cubeb_stream*)>::
        unique_ptr<void(*)(cubeb_stream*),void>
                  ((unique_ptr<cubeb_stream,_void_(*)(cubeb_stream_*)> *)
                   CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),__p,
                   (__enable_if_t<_is_lvalue_reference<void_(*)(cubeb_stream_*)>::value,_void_(*&&)(cubeb_stream_*)>
                    )0x133977);
        cubeb_stream_start(__p);
        delay(0);
        cubeb_stream_stop(__p);
        fprintf(_stderr,"Check is disabled in Linux\n");
        std::unique_ptr<cubeb_stream,_void_(*)(cubeb_stream_*)>::~unique_ptr
                  ((unique_ptr<cubeb_stream,_void_(*)(cubeb_stream_*)> *)
                   CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      }
    }
    std::unique_ptr<cubeb,_void_(*)(cubeb_*)>::~unique_ptr
              ((unique_ptr<cubeb,_void_(*)(cubeb_*)> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  }
  return;
}

Assistant:

TEST(cubeb, record)
{
  if (cubeb_set_log_callback(CUBEB_LOG_DISABLED, nullptr /*print_log*/) != CUBEB_OK) {
    fprintf(stderr, "Set log callback failed\n");
  }
  cubeb *ctx;
  cubeb_stream *stream;
  cubeb_stream_params params;
  int r;
  user_state_record stream_state;

  r = common_init(&ctx, "Cubeb record example");
  ASSERT_EQ(r, CUBEB_OK) << "Error initializing cubeb library";

  std::unique_ptr<cubeb, decltype(&cubeb_destroy)>
    cleanup_cubeb_at_exit(ctx, cubeb_destroy);

  /* This test needs an available input device, skip it if this host does not
   * have one. */
  if (!has_available_input_device(ctx)) {
    return;
  }

  params.format = STREAM_FORMAT;
  params.rate = SAMPLE_FREQUENCY;
  params.channels = 1;
  params.layout = CUBEB_LAYOUT_UNDEFINED;
  params.prefs = CUBEB_STREAM_PREF_NONE;

  r = cubeb_stream_init(ctx, &stream, "Cubeb record (mono)", NULL, &params, NULL, nullptr,
                        4096, data_cb_record, state_cb_record, &stream_state);
  ASSERT_EQ(r, CUBEB_OK) << "Error initializing cubeb stream";

  std::unique_ptr<cubeb_stream, decltype(&cubeb_stream_destroy)>
    cleanup_stream_at_exit(stream, cubeb_stream_destroy);

  cubeb_stream_start(stream);
  delay(500);
  cubeb_stream_stop(stream);

#ifdef __linux__
  // user callback does not arrive in Linux, silence the error
  fprintf(stderr, "Check is disabled in Linux\n");
#else
  ASSERT_FALSE(stream_state.invalid_audio_value.load());
#endif
}